

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O0

void __thiscall
FSSMainWindow::FSSMainWindow(FSSMainWindow *this,FSSDataModel *_dataModel,QWidget *parent)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  QWidget *pQVar2;
  QSplitter *this_00;
  FSSResourceModel *this_01;
  QDockWidget *this_02;
  QTreeView *this_03;
  QMenu *pQVar3;
  undefined8 uVar4;
  char *pcVar5;
  FSSSourcesView *pFVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  QAction *pQVar9;
  shared_ptr<Data::Source> *this_04;
  sockaddr *__addr;
  QObject local_1b8 [8];
  QObject local_1b0 [8];
  QKeySequence local_1a8 [8];
  string local_1a0 [32];
  QString local_180;
  QAction *local_168;
  QAction *action_1;
  undefined1 local_150 [8];
  PSource data_source;
  size_t i;
  QKeySequence local_130 [8];
  QString local_128;
  char *local_110;
  QAction *action;
  QString local_100;
  QMenu *local_e8;
  QMenu *menuView;
  QString local_d8;
  undefined8 local_c0;
  QAction *action_src;
  QString local_b0;
  undefined1 local_91;
  QString local_90;
  QMenu *local_78;
  QMenu *menuFile;
  QMenuBar *menuBar;
  QString local_60;
  QWidget *local_48;
  QDockWidget *dockResources;
  QSplitter *local_30;
  QSplitter *mainSplitter;
  QWidget *local_20;
  QWidget *parent_local;
  FSSDataModel *_dataModel_local;
  FSSMainWindow *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)_dataModel;
  _dataModel_local = (FSSDataModel *)this;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)((long)&mainSplitter + 4));
  QMainWindow::QMainWindow
            (&this->super_QMainWindow,parent,(QFlags_conflict1 *)(ulong)mainSplitter._4_4_);
  *(undefined ***)this = &PTR_metaObject_001a3620;
  *(undefined ***)&this->field_0x10 = &PTR__FSSMainWindow_001a37d8;
  this->resourceModel = (FSSResourceModel *)0x0;
  QMap<QAction_*,_std::shared_ptr<Data::Source>_>::QMap(&this->actions);
  this->dataModel = (FSSDataModel *)parent_local;
  this_00 = (QSplitter *)operator_new(0x28);
  QSplitter::QSplitter(this_00,Horizontal,(QWidget *)this);
  local_30 = this_00;
  QMainWindow::setCentralWidget((QWidget *)this);
  this_01 = (FSSResourceModel *)operator_new(0x10);
  FSSResourceModel::FSSResourceModel(this_01,(QObject *)0x0);
  this->resourceModel = this_01;
  this_02 = (QDockWidget *)operator_new(0x28);
  menuBar._3_1_ = 1;
  QString::QString(&local_60,"Resources");
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)((long)&menuBar + 4));
  QDockWidget::QDockWidget
            (this_02,&local_60,(QWidget *)this,(QFlags_conflict1 *)(ulong)menuBar._4_4_);
  menuBar._3_1_ = 0;
  QString::~QString(&local_60);
  local_48 = (QWidget *)this_02;
  this_03 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(this_03,local_48);
  this->treeResources = this_03;
  QWidget::setSizePolicy((QWidget *)this->treeResources,Preferred,Expanding);
  (**(code **)(*(long *)this->treeResources + 0x1c8))(this->treeResources,this->resourceModel);
  QDockWidget::setWidget(local_48);
  QMainWindow::addDockWidget((DockWidgetArea)this,(QDockWidget *)0x1);
  menuFile = (QMenu *)QMainWindow::menuBar();
  pQVar3 = (QMenu *)operator_new(0x28);
  local_91 = 1;
  QString::QString(&local_90,"File");
  QMenu::QMenu(pQVar3,&local_90,(QWidget *)this);
  local_91 = 0;
  QString::~QString(&local_90);
  local_78 = pQVar3;
  QString::QString(&local_b0,"Export");
  QKeySequence::QKeySequence((QKeySequence *)&action_src);
  QMenu::addAction((QString *)pQVar3,(QObject *)&local_b0,(char *)this,
                   (QKeySequence *)"1exportSource()");
  QKeySequence::~QKeySequence((QKeySequence *)&action_src);
  QString::~QString(&local_b0);
  QMenuBar::addMenu(menuFile);
  pQVar3 = local_78;
  QString::QString(&local_d8,"Sources");
  QKeySequence::QKeySequence((QKeySequence *)&menuView);
  uVar4 = QMenu::addAction((QString *)pQVar3,(QObject *)&local_d8,(char *)this,
                           (QKeySequence *)"1openSources()");
  QKeySequence::~QKeySequence((QKeySequence *)&menuView);
  QString::~QString(&local_d8);
  local_c0 = uVar4;
  QAction::setMenuRole((MenuRole)uVar4);
  pQVar3 = (QMenu *)operator_new(0x28);
  action._7_1_ = 1;
  QString::QString(&local_100,"View");
  QMenu::QMenu(pQVar3,&local_100,(QWidget *)this);
  action._7_1_ = 0;
  QString::~QString(&local_100);
  local_e8 = pQVar3;
  QMenuBar::addMenu(menuFile);
  pQVar3 = local_e8;
  QString::QString(&local_128,"Resources");
  pQVar2 = local_48;
  QKeySequence::QKeySequence(local_130);
  pcVar5 = (char *)QMenu::addAction((QString *)pQVar3,(QObject *)&local_128,(char *)pQVar2,
                                    (QKeySequence *)"1setVisible(bool)");
  QKeySequence::~QKeySequence(local_130);
  QString::~QString(&local_128);
  local_110 = pcVar5;
  QAction::setCheckable(SUB81(pcVar5,0));
  QObject::connect((QObject *)&i,(char *)local_48,(QObject *)"2visibilityChanged(bool)",local_110,
                   0x1756db);
  QMetaObject::Connection::~Connection((Connection *)&i);
  QMenu::addSeparator();
  pFVar6 = (FSSSourcesView *)operator_new(0x40);
  FSSSourcesView::FSSSourcesView(pFVar6,(QWidget *)local_30);
  this->viewSources = pFVar6;
  QWidget::setSizePolicy((QWidget *)this->viewSources,Expanding,Expanding);
  data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             FSSDataModel::dataSourceCount(this->dataModel);
    if (p_Var7 <= _Var1._M_pi) break;
    FSSDataModel::getDataSource((FSSDataModel *)local_150,(size_t)this->dataModel);
    pFVar6 = this->viewSources;
    std::shared_ptr<Data::Source>::shared_ptr
              ((shared_ptr<Data::Source> *)&action_1,(shared_ptr<Data::Source> *)local_150);
    FSSSourcesView::addSource(pFVar6,(shared_ptr<Data::Source> *)&action_1);
    std::shared_ptr<Data::Source>::~shared_ptr((shared_ptr<Data::Source> *)&action_1);
    pQVar3 = local_e8;
    peVar8 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_150);
    (**peVar8->_vptr_Source)(local_1a0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    QString::QString(&local_180,pcVar5);
    QKeySequence::QKeySequence(local_1a8);
    pQVar9 = (QAction *)
             QMenu::addAction((QString *)pQVar3,(QObject *)&local_180,(char *)this,
                              (QKeySequence *)"1switchSource(bool)");
    QKeySequence::~QKeySequence(local_1a8);
    QString::~QString(&local_180);
    std::__cxx11::string::~string(local_1a0);
    local_168 = pQVar9;
    QAction::setCheckable(SUB81(pQVar9,0));
    QAction::setChecked(SUB81(local_168,0));
    this_04 = QMap<QAction_*,_std::shared_ptr<Data::Source>_>::operator[](&this->actions,&local_168)
    ;
    std::shared_ptr<Data::Source>::operator=(this_04,(shared_ptr<Data::Source> *)local_150);
    std::shared_ptr<Data::Source>::~shared_ptr((shared_ptr<Data::Source> *)local_150);
    data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  __addr = (sockaddr *)QAbstractItemView::selectionModel();
  QObject::connect(local_1b0,(DockWidgetArea)this,__addr,0x175701);
  QMetaObject::Connection::~Connection((Connection *)local_1b0);
  QObject::connect(local_1b8,(char *)this,(QObject *)"2resourceSelected(Data::Resource,uint)",
                   (char *)this->viewSources,0x17577c);
  QMetaObject::Connection::~Connection((Connection *)local_1b8);
  return;
}

Assistant:

FSSMainWindow::FSSMainWindow(FSSDataModel *_dataModel, QWidget *parent)
  : QMainWindow(parent)
  , resourceModel(nullptr)
  , dataModel(_dataModel) {
  QSplitter *mainSplitter = new QSplitter(Qt::Horizontal, this);
  setCentralWidget(mainSplitter);

  resourceModel = new FSSResourceModel();

  QDockWidget *dockResources = new QDockWidget("Resources", this);
  treeResources = new QTreeView(dockResources);
  treeResources->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Expanding);
  treeResources->setModel(resourceModel);
  dockResources->setWidget(treeResources);
  addDockWidget(Qt::LeftDockWidgetArea, dockResources);

  QMenuBar *menuBar = this->menuBar();

  QMenu *menuFile = new QMenu("File", this);
  menuFile->addAction("Export", this, SLOT(exportSource()));
  menuBar->addMenu(menuFile);
  QAction *action_src = menuFile->addAction("Sources", this,
                                            SLOT(openSources()));
  action_src->setMenuRole(QAction::PreferencesRole);

  QMenu *menuView = new QMenu("View", this);
  menuBar->addMenu(menuView);
  QAction *action = menuView->addAction("Resources", dockResources,
                                        SLOT(setVisible(bool)));
  action->setCheckable(true);
  connect(dockResources, SIGNAL(visibilityChanged(bool)), action,
          SLOT(setChecked(bool)));

  menuView->addSeparator();

  viewSources = new FSSSourcesView(mainSplitter);
  viewSources->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);

  for (size_t i = 0; i < dataModel->dataSourceCount(); i++) {
    Data::PSource data_source = dataModel->getDataSource(i);
    viewSources->addSource(data_source);
    QAction *action = menuView->addAction(data_source->get_name().c_str(),
                                          this, SLOT(switchSource(bool)));
    action->setCheckable(true);
    action->setChecked(true);
    actions[action] = data_source;
  }

  connect(treeResources->selectionModel(),
          SIGNAL(currentChanged(QModelIndex,QModelIndex)),
          SLOT(onCurrentChanged(QModelIndex,QModelIndex)));

  connect(this, SIGNAL(resourceSelected(Data::Resource,uint)),
          viewSources, SLOT(onResourceSelected(Data::Resource,uint)));
}